

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O2

void fill_inverse_cmap(j_decompress_ptr cinfo,int c0,int c1,int c2)

{
  byte bVar1;
  J_COLOR_SPACE JVar2;
  _func_void_j_decompress_ptr *p_Var3;
  JSAMPARRAY ppJVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long *plVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  byte *pbVar35;
  uint uVar36;
  JSAMPLE colorlist [256];
  JLONG mindist [256];
  long local_a10;
  byte local_9b8 [128];
  byte abStack_938 [256];
  long local_838 [257];
  
  p_Var3 = cinfo->cquantize[1].finish_pass;
  uVar5 = c0 * 8 & 0xffffffe0;
  uVar22 = c1 * 4 & 0xffffffe0;
  uVar16 = uVar22 + 2;
  uVar17 = c2 * 8 & 0xffffffe0;
  uVar13 = uVar17 + 4;
  uVar27 = c0 * 8 | 0x1c;
  uVar6 = uVar5 | 4;
  uVar29 = c1 * 4 | 0x1e;
  uVar31 = c2 * 8 | 0x1c;
  uVar33 = 0;
  uVar23 = (ulong)(uint)cinfo->actual_number_of_colors;
  if (cinfo->actual_number_of_colors < 1) {
    uVar23 = uVar33;
  }
  lVar34 = 0x7fffffff;
  do {
    if (uVar23 == uVar33) {
      uVar5 = 0;
      for (uVar33 = 0; uVar23 != uVar33; uVar33 = uVar33 + 1) {
        if (local_838[uVar33] <= lVar34) {
          lVar30 = (long)(int)uVar5;
          uVar5 = uVar5 + 1;
          abStack_938[lVar30] = (byte)uVar33;
        }
      }
      plVar11 = local_838;
      for (iVar14 = 0x7f; -1 < iVar14; iVar14 = iVar14 + -1) {
        *plVar11 = 0x7fffffff;
        plVar11 = plVar11 + 1;
      }
      uVar33 = 0;
      uVar23 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar23 = uVar33;
      }
      for (; uVar33 != uVar23; uVar33 = uVar33 + 1) {
        bVar1 = abStack_938[uVar33];
        ppJVar4 = cinfo->colormap;
        uVar12 = (ulong)cinfo->out_color_space;
        iVar14 = c_scales[rgb_red[uVar12]];
        lVar34 = (long)(int)((uVar6 - (*ppJVar4)[bVar1]) * iVar14);
        iVar7 = c_scales[rgb_green[uVar12]];
        lVar15 = (long)(int)((uVar16 - ppJVar4[1][bVar1]) * iVar7);
        iVar8 = c_scales[rgb_blue[uVar12]];
        lVar30 = (long)(int)((uVar13 - ppJVar4[2][bVar1]) * iVar8);
        lVar10 = lVar30 * lVar30 + lVar15 * lVar15 + lVar34 * lVar34;
        local_a10 = (ulong)(uint)(iVar14 * 8 * iVar14 * 8) + iVar14 * lVar34 * 0x10;
        plVar11 = local_838;
        pbVar35 = local_9b8;
        for (iVar14 = 3; -1 < iVar14; iVar14 = iVar14 + -1) {
          lVar34 = (ulong)(uint)(iVar7 * 4 * iVar7 * 4) + iVar7 * lVar15 * 8;
          lVar25 = lVar10;
          for (iVar19 = 7; -1 < iVar19; iVar19 = iVar19 + -1) {
            lVar26 = (ulong)(uint)(iVar8 * 8 * iVar8 * 8) + iVar8 * lVar30 * 0x10;
            lVar28 = lVar25;
            for (iVar21 = 3; -1 < iVar21; iVar21 = iVar21 + -1) {
              if (lVar28 < *plVar11) {
                *plVar11 = lVar28;
                *pbVar35 = bVar1;
                uVar12 = (ulong)cinfo->out_color_space;
              }
              lVar28 = lVar28 + lVar26;
              lVar26 = lVar26 + c_scales[rgb_blue[uVar12]] * c_scales[rgb_blue[uVar12]] * 0x80;
              plVar11 = plVar11 + 1;
              pbVar35 = pbVar35 + 1;
            }
            lVar25 = lVar25 + lVar34;
            lVar34 = lVar34 + c_scales[rgb_green[uVar12]] * c_scales[rgb_green[uVar12]] * 0x20;
          }
          lVar10 = lVar10 + local_a10;
          local_a10 = local_a10 + c_scales[rgb_red[uVar12]] * c_scales[rgb_red[uVar12]] * 0x80;
        }
      }
      pbVar35 = local_9b8;
      for (uVar23 = 0; uVar23 != 4; uVar23 = uVar23 + 1) {
        lVar34 = *(long *)(p_Var3 + (uVar23 | (long)(int)(c0 & 0xfffffffc)) * 8) +
                 (long)(int)(c1 & 0xfffffff8) * 0x40 + (ulong)((uint)c2 >> 2) * 8;
        for (lVar30 = 0; lVar30 != 8; lVar30 = lVar30 + 1) {
          for (lVar10 = 0; (int)lVar10 != 4; lVar10 = lVar10 + 1) {
            *(ushort *)(lVar34 + lVar10 * 2) = pbVar35[lVar10] + 1;
          }
          pbVar35 = pbVar35 + lVar10;
          lVar34 = lVar34 + 0x40;
        }
      }
      return;
    }
    ppJVar4 = cinfo->colormap;
    bVar1 = (*ppJVar4)[uVar33];
    uVar24 = (uint)bVar1;
    JVar2 = cinfo->out_color_space;
    iVar14 = c_scales[rgb_red[JVar2]];
    if ((int)uVar24 < (int)uVar6) {
      lVar30 = (long)(int)((uVar24 - uVar6) * iVar14);
      lVar30 = lVar30 * lVar30;
      uVar32 = uVar27;
    }
    else {
      iVar7 = bVar1 - uVar27;
      uVar32 = uVar6;
      if (iVar7 == 0 || (int)(uint)bVar1 < (int)uVar27) {
        if (uVar24 <= uVar5 + uVar27 + 4 >> 1) {
          uVar32 = uVar27;
        }
        lVar30 = 0;
      }
      else {
        lVar30 = (long)(iVar7 * iVar14);
        lVar30 = lVar30 * lVar30;
      }
    }
    bVar1 = ppJVar4[1][uVar33];
    uVar20 = (uint)bVar1;
    iVar7 = c_scales[rgb_green[JVar2]];
    if ((int)uVar20 < (int)uVar16) {
      lVar10 = (long)(int)((uVar20 - uVar16) * iVar7);
      lVar30 = lVar30 + lVar10 * lVar10;
LAB_0012f0a7:
      uVar9 = uVar29;
    }
    else {
      iVar8 = bVar1 - uVar29;
      uVar9 = uVar16;
      if (iVar8 == 0 || (int)(uint)bVar1 < (int)uVar29) {
        if (uVar20 <= uVar22 + uVar29 + 2 >> 1) goto LAB_0012f0a7;
      }
      else {
        lVar10 = (long)(iVar8 * iVar7);
        lVar30 = lVar30 + lVar10 * lVar10;
      }
    }
    bVar1 = ppJVar4[2][uVar33];
    uVar18 = (uint)bVar1;
    iVar8 = c_scales[rgb_blue[JVar2]];
    if ((int)uVar18 < (int)uVar13) {
      lVar10 = (long)(int)((uVar18 - uVar13) * iVar8);
      lVar30 = lVar30 + lVar10 * lVar10;
LAB_0012f0fa:
      uVar36 = uVar31;
    }
    else {
      uVar36 = uVar13;
      if (uVar18 - uVar31 == 0 || (int)uVar18 < (int)uVar31) {
        if ((uint)bVar1 <= uVar17 + uVar31 + 4 >> 1) goto LAB_0012f0fa;
      }
      else {
        lVar10 = (long)(int)((uVar18 - uVar31) * iVar8);
        lVar30 = lVar30 + lVar10 * lVar10;
      }
    }
    lVar25 = (long)(int)((uVar24 - uVar32) * iVar14);
    lVar10 = (long)(int)((uVar20 - uVar9) * iVar7);
    lVar15 = (long)(int)((bVar1 - uVar36) * iVar8);
    lVar10 = lVar15 * lVar15 + lVar10 * lVar10 + lVar25 * lVar25;
    local_838[uVar33] = lVar30;
    if (lVar10 < lVar34) {
      lVar34 = lVar10;
    }
    uVar33 = uVar33 + 1;
  } while( true );
}

Assistant:

LOCAL(void)
fill_inverse_cmap(j_decompress_ptr cinfo, int c0, int c1, int c2)
/* Fill the inverse-colormap entries in the update box that contains */
/* histogram cell c0/c1/c2.  (Only that one cell MUST be filled, but */
/* we can fill as many others as we wish.) */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int minc0, minc1, minc2;      /* lower left corner of update box */
  int ic0, ic1, ic2;
  register JSAMPLE *cptr;       /* pointer into bestcolor[] array */
  register histptr cachep;      /* pointer into main cache array */
  /* This array lists the candidate colormap indexes. */
  JSAMPLE colorlist[MAXNUMCOLORS];
  int numcolors;                /* number of candidate colors */
  /* This array holds the actually closest colormap index for each cell. */
  JSAMPLE bestcolor[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

  /* Convert cell coordinates to update box ID */
  c0 >>= BOX_C0_LOG;
  c1 >>= BOX_C1_LOG;
  c2 >>= BOX_C2_LOG;

  /* Compute true coordinates of update box's origin corner.
   * Actually we compute the coordinates of the center of the corner
   * histogram cell, which are the lower bounds of the volume we care about.
   */
  minc0 = (c0 << BOX_C0_SHIFT) + ((1 << C0_SHIFT) >> 1);
  minc1 = (c1 << BOX_C1_SHIFT) + ((1 << C1_SHIFT) >> 1);
  minc2 = (c2 << BOX_C2_SHIFT) + ((1 << C2_SHIFT) >> 1);

  /* Determine which colormap entries are close enough to be candidates
   * for the nearest entry to some cell in the update box.
   */
  numcolors = find_nearby_colors(cinfo, minc0, minc1, minc2, colorlist);

  /* Determine the actually nearest colors. */
  find_best_colors(cinfo, minc0, minc1, minc2, numcolors, colorlist,
                   bestcolor);

  /* Save the best color numbers (plus 1) in the main cache array */
  c0 <<= BOX_C0_LOG;            /* convert ID back to base cell indexes */
  c1 <<= BOX_C1_LOG;
  c2 <<= BOX_C2_LOG;
  cptr = bestcolor;
  for (ic0 = 0; ic0 < BOX_C0_ELEMS; ic0++) {
    for (ic1 = 0; ic1 < BOX_C1_ELEMS; ic1++) {
      cachep = &histogram[c0 + ic0][c1 + ic1][c2];
      for (ic2 = 0; ic2 < BOX_C2_ELEMS; ic2++) {
        *cachep++ = (histcell)((*cptr++) + 1);
      }
    }
  }
}